

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void __thiscall
crnlib::symbol_codec::encode
          (symbol_codec *this,uint bit,adaptive_bit_model *model,bool update_model)

{
  uint uVar1;
  uint uVar2;
  uint orig_base;
  uint x;
  output_symbol sym;
  bool update_model_local;
  adaptive_bit_model *model_local;
  uint bit_local;
  symbol_codec *this_local;
  
  this->m_arith_total_bits = this->m_arith_total_bits + 1;
  sym.m_bits._3_1_ = update_model;
  unique0x10000138 = model;
  if ((this->m_simulate_encoding & 1U) == 0) {
    x._0_2_ = 0xffff;
    x._2_2_ = model->m_bit_0_prob;
    orig_base = bit;
    vector<crnlib::symbol_codec::output_symbol>::push_back
              (&this->m_output_syms,(output_symbol *)&orig_base);
  }
  uVar2 = (uint)stack0xffffffffffffffe0->m_bit_0_prob * (this->m_arith_length >> 0xb);
  if (bit == 0) {
    if ((sym.m_bits._3_1_ & 1) != 0) {
      stack0xffffffffffffffe0->m_bit_0_prob =
           stack0xffffffffffffffe0->m_bit_0_prob +
           (short)(0x800 - stack0xffffffffffffffe0->m_bit_0_prob >> 5);
    }
    this->m_arith_length = uVar2;
  }
  else {
    if ((sym.m_bits._3_1_ & 1) != 0) {
      stack0xffffffffffffffe0->m_bit_0_prob =
           stack0xffffffffffffffe0->m_bit_0_prob -
           (short)((int)(uint)stack0xffffffffffffffe0->m_bit_0_prob >> 5);
    }
    uVar1 = this->m_arith_base;
    this->m_arith_base = uVar2 + this->m_arith_base;
    this->m_arith_length = this->m_arith_length - uVar2;
    if (this->m_arith_base < uVar1) {
      arith_propagate_carry(this);
    }
  }
  if (this->m_arith_length < 0x1000000) {
    arith_renorm_enc_interval(this);
  }
  return;
}

Assistant:

void symbol_codec::encode(uint bit, adaptive_bit_model& model, bool update_model)
    {
        CRNLIB_ASSERT(m_mode == cEncoding);

        m_arith_total_bits++;

        if (!m_simulate_encoding)
        {
            output_symbol sym;
            sym.m_bits = bit;
            sym.m_num_bits = -1;
            sym.m_arith_prob0 = model.m_bit_0_prob;
            m_output_syms.push_back(sym);
        }

        //uint x = gArithProbMulTab[model.m_bit_0_prob >> (cSymbolCodecArithProbBits - cSymbolCodecArithProbMulBits)][m_arith_length >> (32 - cSymbolCodecArithProbMulLenSigBits)] << 16;
        uint x = model.m_bit_0_prob * (m_arith_length >> cSymbolCodecArithProbBits);

        if (!bit)
        {
            if (update_model)
            {
                model.m_bit_0_prob += ((cSymbolCodecArithProbScale - model.m_bit_0_prob) >> cSymbolCodecArithProbMoveBits);
            }

            m_arith_length = x;
        }
        else
        {
            if (update_model)
            {
                model.m_bit_0_prob -= (model.m_bit_0_prob >> cSymbolCodecArithProbMoveBits);
            }

            uint orig_base = m_arith_base;
            m_arith_base += x;
            m_arith_length -= x;
            if (orig_base > m_arith_base)
            {
                arith_propagate_carry();
            }
        }

        if (m_arith_length < cSymbolCodecArithMinLen)
        {
            arith_renorm_enc_interval();
        }
    }